

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall file_base_1::test_method(file_base_1 *this)

{
  unit_test_log_t *puVar1;
  unit_test_log_t *puVar2;
  const_string local_178;
  const_string local_168;
  char *local_158;
  char *local_150;
  const_string local_148;
  const_string local_138;
  char *local_128;
  char *local_120;
  const_string local_118;
  const_string local_108;
  char *local_f8;
  char *local_f0;
  const_string local_e8;
  const_string local_d8;
  char *local_c8;
  char *local_c0;
  const_string local_b8;
  const_string local_a8;
  char *local_98;
  char *local_90;
  const_string local_88;
  const_string local_78;
  char *local_68;
  char *local_60;
  unit_test_log_t local_58;
  undefined1 local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_178.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_178.m_end = "";
  local_168.m_begin = "";
  local_168.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_178,0x19,&local_168);
  puVar1 = &local_58;
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_150 = "";
  local_38 = assert_hash::file_base("a",1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[2]>
            (puVar1,&local_158,0x19,1,2,&local_38,"ah::file_base( \"a\", 1 )","a","\"a\"");
  local_148.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_148.m_end = "";
  local_138.m_begin = "";
  local_138.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_148,0x1a,&local_138);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_120 = "";
  local_38 = assert_hash::file_base("a.txt",1);
  puVar1 = &local_58;
  puVar2 = puVar1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_128,0x1a,1,2,&local_38,"ah::file_base( \"a.txt\", 1 )","a.txt",
             "\"a.txt\"");
  local_118.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_118.m_end = "";
  local_108.m_begin = "";
  local_108.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_118,0x1b,&local_108);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_f0 = "";
  local_38 = assert_hash::file_base(".a.txt",1);
  puVar2 = puVar1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[7]>
            (puVar1,&local_f8,0x1b,1,2,&local_38,"ah::file_base( \".a.txt\", 1 )",".a.txt",
             "\".a.txt\"");
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_e8.m_end = "";
  local_d8.m_begin = "";
  local_d8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_e8,0x1c,&local_d8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_c0 = "";
  local_38 = assert_hash::file_base("dev/null",1);
  puVar2 = puVar1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[6]>
            (puVar1,&local_c8,0x1c,1,2,&local_38,"ah::file_base( \"dev/null\", 1 )","/null",
             "\"/null\"");
  local_b8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b8.m_end = "";
  local_a8.m_begin = "";
  local_a8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_b8,0x1d,&local_a8);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_90 = "";
  local_38 = assert_hash::file_base("/Users/todi/assert_hash/build",1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[7]>
            (puVar1,&local_98,0x1d,1,2,&local_38,
             "ah::file_base( \"/Users/todi/assert_hash/build\", 1 )","/build","\"/build\"");
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_88.m_end = "";
  local_78.m_begin = "";
  local_78.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_88,0x1e,&local_78);
  local_50 = 0;
  local_58.super_test_observer._vptr_test_observer = (test_observer)&PTR__lazy_ostream_001cf9a0;
  local_48 = boost::unit_test::lazy_ostream::inst;
  local_40 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60 = "";
  local_38 = assert_hash::file_base("c:\\asda\\asdasd\\asd\\.a.txt",1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char_const*,char[8]>
            (&local_58,&local_68,0x1e,1,2,&local_38,
             "ah::file_base( \"c:\\\\asda\\\\asdasd\\\\asd\\\\.a.txt\", 1 )","\\.a.txt",
             "\"\\\\.a.txt\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_base_1 )
{
    BOOST_CHECK_EQUAL( ah::file_base( "a", 1 ), "a" );
    BOOST_CHECK_EQUAL( ah::file_base( "a.txt", 1 ), "a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( ".a.txt", 1 ), ".a.txt" );
    BOOST_CHECK_EQUAL( ah::file_base( "dev/null", 1 ), "/null" );
    BOOST_CHECK_EQUAL( ah::file_base( "/Users/todi/assert_hash/build", 1 ), "/build" );
    BOOST_CHECK_EQUAL( ah::file_base( "c:\\asda\\asdasd\\asd\\.a.txt", 1 ), "\\.a.txt" );
}